

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void expand_4_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                 uint32_t cofs,uint32_t oprsz,uint32_t tysz,TCGType_conflict type,_Bool write_aofs,
                 _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict9 *fni)

{
  TCGv_vec r;
  TCGv_vec r_00;
  TCGv_vec r_01;
  TCGv_vec r_02;
  uint uVar1;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_01 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_02 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  if (oprsz != 0) {
    uVar1 = 0;
    do {
      tcg_gen_ld_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
      tcg_gen_ld_vec_tricore(tcg_ctx,r_01,tcg_ctx->cpu_env,(ulong)(bofs + uVar1));
      tcg_gen_ld_vec_tricore(tcg_ctx,r_02,tcg_ctx->cpu_env,(ulong)(cofs + uVar1));
      (*fni)(tcg_ctx,vece,r,r_00,r_01,r_02);
      tcg_gen_st_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(dofs + uVar1));
      if (write_aofs) {
        tcg_gen_st_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
      }
      uVar1 = uVar1 + tysz;
    } while (uVar1 < oprsz);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_02 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_01 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_4_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                         uint32_t bofs, uint32_t cofs, uint32_t oprsz,
                         uint32_t tysz, TCGType type, bool write_aofs,
                         void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec,
                                     TCGv_vec, TCGv_vec))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t2 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t3 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_vec(tcg_ctx, t2, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_ld_vec(tcg_ctx, t3, tcg_ctx->cpu_env, cofs + i);
        fni(tcg_ctx, vece, t0, t1, t2, t3);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
        if (write_aofs) {
            tcg_gen_st_vec(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        }
    }
    tcg_temp_free_vec(tcg_ctx, t3);
    tcg_temp_free_vec(tcg_ctx, t2);
    tcg_temp_free_vec(tcg_ctx, t1);
    tcg_temp_free_vec(tcg_ctx, t0);
}